

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void io_read_all(IOHANDLE io,void **result,uint *result_len)

{
  uint *in_RDX;
  undefined8 *in_RSI;
  uint read;
  uint cap;
  uint len;
  uchar *buffer;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint local_28;
  uint local_24;
  void *local_20;
  
  local_20 = malloc(0x400);
  local_24 = 0;
  local_28 = 0x400;
  *in_RSI = 0;
  *in_RDX = 0;
  while (in_stack_ffffffffffffffd4 =
              io_read((IOHANDLE)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8,0), in_stack_ffffffffffffffd4 != 0) {
    local_24 = in_stack_ffffffffffffffd4 + local_24;
    if (local_24 == local_28) {
      local_28 = local_28 << 1;
      local_20 = realloc(local_20,(ulong)local_28);
    }
  }
  if (local_24 == local_28) {
    local_20 = realloc(local_20,(ulong)(local_28 + 1));
  }
  *(undefined1 *)((long)local_20 + (ulong)local_24) = 0;
  *in_RSI = local_20;
  *in_RDX = local_24;
  return;
}

Assistant:

void io_read_all(IOHANDLE io, void **result, unsigned *result_len)
{
	unsigned char *buffer = malloc(1024);
	unsigned len = 0;
	unsigned cap = 1024;
	unsigned read;

	*result = 0;
	*result_len = 0;

	while((read = io_read(io, buffer + len, cap - len)) != 0)
	{
		len += read;
		if(len == cap)
		{
			cap *= 2;
			buffer = realloc(buffer, cap);
		}
	}
	if(len == cap)
	{
		buffer = realloc(buffer, cap + 1);
	}
	// ensure null termination
	buffer[len] = 0;
	*result = buffer;
	*result_len = len;
}